

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverBB.cpp
# Opt level: O3

void __thiscall chrono::ChSolverBB::ArchiveIN(ChSolverBB *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChSolverBB *)
            &this[-1].super_ChIterativeSolverVI.dlambda_history.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,in_RSI);
  return;
}

Assistant:

void ChSolverBB::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSolverBB>();
    // deserialize parent class
    ChIterativeSolverVI::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(n_armijo);
    marchive >> CHNVP(max_armijo_backtrace);
    marchive >> CHNVP(m_use_precond);
}